

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebra.cpp
# Opt level: O0

void __thiscall lsim::Transform::rotate(Transform *this,float degrees)

{
  float afVar1 [2];
  float fVar2;
  float fVar3;
  float local_38;
  float fStack_34;
  Transform cur;
  float ca;
  float sa;
  float rad;
  float degrees_local;
  Transform *this_local;
  
  fVar2 = anon_unknown.dwarf_177697::deg2rad(degrees);
  fVar3 = sinf(fVar2);
  fVar2 = cosf(fVar2);
  afVar1 = this->m_el[2];
  local_38 = SUB84(this->m_el[0],0);
  fStack_34 = SUB84(this->m_el[0],4);
  this->m_el[0][0] = fVar2 * local_38 + -(fVar3 * fStack_34);
  cur.m_el[0][0] = SUB84(this->m_el[1],0);
  cur.m_el[0][1] = SUB84(this->m_el[1],4);
  this->m_el[1][0] = fVar2 * cur.m_el[0][0] + -(fVar3 * cur.m_el[0][1]);
  cur.m_el[1][0] = afVar1[0];
  cur.m_el[1][1] = afVar1[1];
  this->m_el[2][0] = fVar2 * cur.m_el[1][0] + -(fVar3 * cur.m_el[1][1]);
  this->m_el[0][1] = fVar3 * local_38 + fVar2 * fStack_34;
  this->m_el[1][1] = fVar3 * cur.m_el[0][0] + fVar2 * cur.m_el[0][1];
  this->m_el[2][1] = fVar3 * cur.m_el[1][0] + fVar2 * cur.m_el[1][1];
  return;
}

Assistant:

void Transform::rotate(float degrees) {
	const float rad = deg2rad(degrees);
	const float sa = sinf(rad);
	const float ca = cosf(rad);
	const Transform cur(*this);

	m_el[0][0] = ca * cur.m_el[0][0] - sa * cur.m_el[0][1];
	m_el[1][0] = ca * cur.m_el[1][0] - sa * cur.m_el[1][1];
	m_el[2][0] = ca * cur.m_el[2][0] - sa * cur.m_el[2][1];

	m_el[0][1] = sa * cur.m_el[0][0] + ca * cur.m_el[0][1];
	m_el[1][1] = sa * cur.m_el[1][0] + ca * cur.m_el[1][1];
	m_el[2][1] = sa * cur.m_el[2][0] + ca * cur.m_el[2][1];
}